

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::Append
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,char *ip,size_t len,
          char **op_p)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = *op_p;
  if ((ulong)((long)this->op_limit_ - (long)pcVar2) < len) {
    this->op_ptr_ = pcVar2;
    bVar1 = SlowAppend(this,ip,len);
    pcVar2 = this->op_ptr_;
  }
  else {
    switchD_00916250::default(pcVar2,ip,len);
    pcVar2 = pcVar2 + len;
    bVar1 = true;
  }
  *op_p = pcVar2;
  return bVar1;
}

Assistant:

inline bool Append(const char* ip, size_t len, char** op_p) {
    char* op = *op_p;
    size_t avail = op_limit_ - op;
    if (len <= avail) {
      // Fast path
      std::memcpy(op, ip, len);
      *op_p = op + len;
      return true;
    } else {
      op_ptr_ = op;
      bool res = SlowAppend(ip, len);
      *op_p = op_ptr_;
      return res;
    }
  }